

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.c
# Opt level: O2

int labeled_expand(ptls_hpke_kem_t *kem,ptls_hpke_cipher_suite_t *cipher,void *output,size_t outlen,
                  ptls_iovec_t prk,char *label,ptls_iovec_t info)

{
  ptls_iovec_t info_00;
  int iVar1;
  size_t len;
  ptls_iovec_t prk_00;
  undefined1 local_b2;
  undefined1 local_b1;
  size_t local_b0;
  ptls_buffer_t labeled_info;
  uint8_t labeled_info_smallbuf [64];
  
  local_b0 = prk.len;
  if (outlen < 0xffff) {
    labeled_info.base = labeled_info_smallbuf;
    labeled_info.off = 0;
    labeled_info.capacity = 0x40;
    labeled_info.is_allocated = '\0';
    labeled_info.align_bits = '\0';
    local_b2 = (undefined1)(outlen >> 8);
    local_b1 = (undefined1)outlen;
    iVar1 = ptls_buffer__do_pushv(&labeled_info,&local_b2,2);
    if (iVar1 == 0) {
      iVar1 = ptls_buffer__do_pushv(&labeled_info,"HPKE-v1",7);
      if (iVar1 == 0) {
        iVar1 = build_suite_id(&labeled_info,kem,cipher);
        if (iVar1 == 0) {
          len = strlen(label);
          iVar1 = ptls_buffer__do_pushv(&labeled_info,label,len);
          if (iVar1 == 0) {
            iVar1 = ptls_buffer__do_pushv(&labeled_info,info.base,info.len);
            if (iVar1 == 0) {
              if (cipher != (ptls_hpke_cipher_suite_t *)0x0) {
                kem = (ptls_hpke_kem_t *)cipher;
              }
              info_00.len = labeled_info.off;
              info_00.base = labeled_info.base;
              prk_00.len = local_b0;
              prk_00.base = prk.base;
              iVar1 = ptls_hkdf_expand(((ptls_hpke_cipher_suite_t *)kem)->hash,output,outlen,prk_00,
                                       info_00);
            }
          }
        }
      }
    }
    ptls_buffer_dispose(&labeled_info);
    return iVar1;
  }
  __assert_fail("outlen < UINT16_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/hpke.c",0x4d,
                "int labeled_expand(ptls_hpke_kem_t *, ptls_hpke_cipher_suite_t *, void *, size_t, ptls_iovec_t, const char *, ptls_iovec_t)"
               );
}

Assistant:

static int labeled_expand(ptls_hpke_kem_t *kem, ptls_hpke_cipher_suite_t *cipher, void *output, size_t outlen, ptls_iovec_t prk,
                          const char *label, ptls_iovec_t info)
{
    ptls_buffer_t labeled_info;
    uint8_t labeled_info_smallbuf[64];
    int ret;

    assert(outlen < UINT16_MAX);

    ptls_buffer_init(&labeled_info, labeled_info_smallbuf, sizeof(labeled_info_smallbuf));

    ptls_buffer_push16(&labeled_info, (uint16_t)outlen);
    ptls_buffer_pushv(&labeled_info, HPKE_V1_LABEL, strlen(HPKE_V1_LABEL));
    if ((ret = build_suite_id(&labeled_info, kem, cipher)) != 0)
        goto Exit;
    ptls_buffer_pushv(&labeled_info, label, strlen(label));
    ptls_buffer_pushv(&labeled_info, info.base, info.len);

    ret = ptls_hkdf_expand(cipher != NULL ? cipher->hash : kem->hash, output, outlen, prk,
                           ptls_iovec_init(labeled_info.base, labeled_info.off));

Exit:
    ptls_buffer_dispose(&labeled_info);
    return ret;
}